

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFInterpolater.cpp
# Opt level: O1

Box * __thiscall
amrex::MFCellBilinear::CoarseBox
          (Box *__return_storage_ptr__,MFCellBilinear *this,Box *fine,IntVect *ratio)

{
  int *piVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int i;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int dir;
  long lVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int local_14 [3];
  
  uVar3 = *(undefined8 *)(fine->smallend).vect;
  uVar4 = *(undefined8 *)((fine->smallend).vect + 2);
  uVar5 = *(undefined8 *)((fine->bigend).vect + 2);
  *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)(fine->bigend).vect;
  *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar5;
  *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar3;
  *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar4;
  iVar7 = ratio->vect[0];
  iVar9 = ratio->vect[1];
  if (((iVar7 == 1) && (iVar9 == 1)) && (ratio->vect[2] == 1)) goto LAB_004c7f10;
  uVar6 = (__return_storage_ptr__->smallend).vect[0];
  if (iVar7 != 1) {
    if (iVar7 == 4) {
      if ((int)uVar6 < 0) {
        uVar6 = uVar6 + 1;
        uVar13 = -uVar6;
        if (0 < (int)uVar6) {
          uVar13 = uVar6;
        }
        uVar13 = uVar13 >> 2;
LAB_004c7b30:
        uVar6 = ~uVar13;
      }
      else {
        uVar6 = uVar6 >> 2;
      }
    }
    else if (iVar7 == 2) {
      if ((int)uVar6 < 0) {
        uVar6 = uVar6 + 1;
        uVar13 = -uVar6;
        if (0 < (int)uVar6) {
          uVar13 = uVar6;
        }
        uVar13 = uVar13 >> 1;
        goto LAB_004c7b30;
      }
      uVar6 = uVar6 >> 1;
    }
    else if ((int)uVar6 < 0) {
      iVar14 = uVar6 + 1;
      iVar2 = -iVar14;
      if (0 < iVar14) {
        iVar2 = iVar14;
      }
      uVar6 = ~(iVar2 / iVar7);
    }
    else {
      uVar6 = (int)uVar6 / iVar7;
    }
  }
  (__return_storage_ptr__->smallend).vect[0] = uVar6;
  uVar6 = (__return_storage_ptr__->smallend).vect[1];
  if (iVar9 != 1) {
    if (iVar9 == 4) {
      if ((int)uVar6 < 0) {
        uVar6 = uVar6 + 1;
        uVar13 = -uVar6;
        if (0 < (int)uVar6) {
          uVar13 = uVar6;
        }
        uVar13 = uVar13 >> 2;
LAB_004c7b92:
        uVar6 = ~uVar13;
      }
      else {
        uVar6 = uVar6 >> 2;
      }
    }
    else if (iVar9 == 2) {
      if ((int)uVar6 < 0) {
        uVar6 = uVar6 + 1;
        uVar13 = -uVar6;
        if (0 < (int)uVar6) {
          uVar13 = uVar6;
        }
        uVar13 = uVar13 >> 1;
        goto LAB_004c7b92;
      }
      uVar6 = uVar6 >> 1;
    }
    else if ((int)uVar6 < 0) {
      iVar14 = uVar6 + 1;
      iVar2 = -iVar14;
      if (0 < iVar14) {
        iVar2 = iVar14;
      }
      uVar6 = ~(iVar2 / iVar9);
    }
    else {
      uVar6 = (int)uVar6 / iVar9;
    }
  }
  (__return_storage_ptr__->smallend).vect[1] = uVar6;
  uVar6 = (__return_storage_ptr__->smallend).vect[2];
  iVar2 = ratio->vect[2];
  if (iVar2 != 1) {
    if (iVar2 == 4) {
      if ((int)uVar6 < 0) {
        uVar6 = uVar6 + 1;
        uVar13 = -uVar6;
        if (0 < (int)uVar6) {
          uVar13 = uVar6;
        }
        uVar13 = uVar13 >> 2;
LAB_004c7bf9:
        uVar6 = ~uVar13;
      }
      else {
        uVar6 = uVar6 >> 2;
      }
    }
    else if (iVar2 == 2) {
      if ((int)uVar6 < 0) {
        uVar6 = uVar6 + 1;
        uVar13 = -uVar6;
        if (0 < (int)uVar6) {
          uVar13 = uVar6;
        }
        uVar13 = uVar13 >> 1;
        goto LAB_004c7bf9;
      }
      uVar6 = uVar6 >> 1;
    }
    else if ((int)uVar6 < 0) {
      iVar12 = uVar6 + 1;
      iVar14 = -iVar12;
      if (0 < iVar12) {
        iVar14 = iVar12;
      }
      uVar6 = ~(iVar14 / iVar2);
    }
    else {
      uVar6 = (int)uVar6 / iVar2;
    }
  }
  (__return_storage_ptr__->smallend).vect[2] = uVar6;
  uVar6 = (__return_storage_ptr__->btype).itype;
  if (uVar6 == 0) {
    uVar6 = (__return_storage_ptr__->bigend).vect[0];
    if (iVar7 != 1) {
      if (iVar7 == 4) {
        if ((int)uVar6 < 0) {
          uVar6 = uVar6 + 1;
          uVar13 = -uVar6;
          if (0 < (int)uVar6) {
            uVar13 = uVar6;
          }
          uVar13 = uVar13 >> 2;
LAB_004c7e30:
          uVar6 = ~uVar13;
        }
        else {
          uVar6 = uVar6 >> 2;
        }
      }
      else if (iVar7 == 2) {
        if ((int)uVar6 < 0) {
          uVar6 = uVar6 + 1;
          uVar13 = -uVar6;
          if (0 < (int)uVar6) {
            uVar13 = uVar6;
          }
          uVar13 = uVar13 >> 1;
          goto LAB_004c7e30;
        }
        uVar6 = uVar6 >> 1;
      }
      else if ((int)uVar6 < 0) {
        iVar12 = uVar6 + 1;
        iVar14 = -iVar12;
        if (0 < iVar12) {
          iVar14 = iVar12;
        }
        uVar6 = ~(iVar14 / iVar7);
      }
      else {
        uVar6 = (int)uVar6 / iVar7;
      }
    }
    (__return_storage_ptr__->bigend).vect[0] = uVar6;
    uVar6 = (__return_storage_ptr__->bigend).vect[1];
    if (iVar9 != 1) {
      if (iVar9 == 4) {
        if ((int)uVar6 < 0) {
          uVar6 = uVar6 + 1;
          uVar13 = -uVar6;
          if (0 < (int)uVar6) {
            uVar13 = uVar6;
          }
          uVar13 = uVar13 >> 2;
LAB_004c7e93:
          uVar6 = ~uVar13;
        }
        else {
          uVar6 = uVar6 >> 2;
        }
      }
      else if (iVar9 == 2) {
        if ((int)uVar6 < 0) {
          uVar6 = uVar6 + 1;
          uVar13 = -uVar6;
          if (0 < (int)uVar6) {
            uVar13 = uVar6;
          }
          uVar13 = uVar13 >> 1;
          goto LAB_004c7e93;
        }
        uVar6 = uVar6 >> 1;
      }
      else if ((int)uVar6 < 0) {
        iVar14 = uVar6 + 1;
        iVar7 = -iVar14;
        if (0 < iVar14) {
          iVar7 = iVar14;
        }
        uVar6 = ~(iVar7 / iVar9);
      }
      else {
        uVar6 = (int)uVar6 / iVar9;
      }
    }
    (__return_storage_ptr__->bigend).vect[1] = uVar6;
    uVar6 = (__return_storage_ptr__->bigend).vect[2];
    if (iVar2 != 1) {
      if (iVar2 == 4) {
        if ((int)uVar6 < 0) {
          uVar6 = uVar6 + 1;
          uVar13 = -uVar6;
          if (0 < (int)uVar6) {
            uVar13 = uVar6;
          }
          uVar13 = uVar13 >> 2;
LAB_004c7ef6:
          uVar6 = ~uVar13;
        }
        else {
          uVar6 = uVar6 >> 2;
        }
      }
      else if (iVar2 == 2) {
        if ((int)uVar6 < 0) {
          uVar6 = uVar6 + 1;
          uVar13 = -uVar6;
          if (0 < (int)uVar6) {
            uVar13 = uVar6;
          }
          uVar13 = uVar13 >> 1;
          goto LAB_004c7ef6;
        }
        uVar6 = uVar6 >> 1;
      }
      else if ((int)uVar6 < 0) {
        iVar9 = uVar6 + 1;
        iVar7 = -iVar9;
        if (0 < iVar9) {
          iVar7 = iVar9;
        }
        uVar6 = ~(iVar7 / iVar2);
      }
      else {
        uVar6 = (int)uVar6 / iVar2;
      }
    }
    (__return_storage_ptr__->bigend).vect[2] = uVar6;
    goto LAB_004c7f10;
  }
  local_14[0] = 0;
  local_14[1] = 0;
  local_14[2] = 0;
  lVar11 = 0;
  do {
    if (((uVar6 >> ((uint)lVar11 & 0x1f) & 1) != 0) &&
       ((__return_storage_ptr__->bigend).vect[lVar11] % ratio->vect[lVar11] != 0)) {
      local_14[lVar11] = 1;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  uVar6 = (__return_storage_ptr__->bigend).vect[0];
  if (iVar7 != 1) {
    if (iVar7 == 4) {
      if ((int)uVar6 < 0) {
        uVar6 = uVar6 + 1;
        uVar13 = -uVar6;
        if (0 < (int)uVar6) {
          uVar13 = uVar6;
        }
        uVar13 = uVar13 >> 2;
LAB_004c7cfb:
        uVar6 = ~uVar13;
      }
      else {
        uVar6 = uVar6 >> 2;
      }
    }
    else if (iVar7 == 2) {
      if ((int)uVar6 < 0) {
        uVar6 = uVar6 + 1;
        uVar13 = -uVar6;
        if (0 < (int)uVar6) {
          uVar13 = uVar6;
        }
        uVar13 = uVar13 >> 1;
        goto LAB_004c7cfb;
      }
      uVar6 = uVar6 >> 1;
    }
    else if ((int)uVar6 < 0) {
      iVar12 = uVar6 + 1;
      iVar14 = -iVar12;
      if (0 < iVar12) {
        iVar14 = iVar12;
      }
      uVar6 = ~(iVar14 / iVar7);
    }
    else {
      uVar6 = (int)uVar6 / iVar7;
    }
  }
  (__return_storage_ptr__->bigend).vect[0] = uVar6;
  uVar13 = (__return_storage_ptr__->bigend).vect[1];
  if (iVar9 != 1) {
    if (iVar9 == 4) {
      if ((int)uVar13 < 0) {
        uVar13 = uVar13 + 1;
        uVar8 = -uVar13;
        if (0 < (int)uVar13) {
          uVar8 = uVar13;
        }
        uVar8 = uVar8 >> 2;
LAB_004c7d74:
        uVar13 = ~uVar8;
      }
      else {
        uVar13 = uVar13 >> 2;
      }
    }
    else if (iVar9 == 2) {
      if ((int)uVar13 < 0) {
        uVar13 = uVar13 + 1;
        uVar8 = -uVar13;
        if (0 < (int)uVar13) {
          uVar8 = uVar13;
        }
        uVar8 = uVar8 >> 1;
        goto LAB_004c7d74;
      }
      uVar13 = uVar13 >> 1;
    }
    else if ((int)uVar13 < 0) {
      iVar14 = uVar13 + 1;
      iVar7 = -iVar14;
      if (0 < iVar14) {
        iVar7 = iVar14;
      }
      uVar13 = ~(iVar7 / iVar9);
    }
    else {
      uVar13 = (int)uVar13 / iVar9;
    }
  }
  (__return_storage_ptr__->bigend).vect[1] = uVar13;
  uVar8 = (__return_storage_ptr__->bigend).vect[2];
  if (iVar2 != 1) {
    if (iVar2 == 4) {
      if ((int)uVar8 < 0) {
        uVar8 = uVar8 + 1;
        uVar10 = -uVar8;
        if (0 < (int)uVar8) {
          uVar10 = uVar8;
        }
        uVar10 = uVar10 >> 2;
LAB_004c7dde:
        uVar8 = ~uVar10;
      }
      else {
        uVar8 = uVar8 >> 2;
      }
    }
    else if (iVar2 == 2) {
      if ((int)uVar8 < 0) {
        uVar8 = uVar8 + 1;
        uVar10 = -uVar8;
        if (0 < (int)uVar8) {
          uVar10 = uVar8;
        }
        uVar10 = uVar10 >> 1;
        goto LAB_004c7dde;
      }
      uVar8 = uVar8 >> 1;
    }
    else if ((int)uVar8 < 0) {
      iVar9 = uVar8 + 1;
      iVar7 = -iVar9;
      if (0 < iVar9) {
        iVar7 = iVar9;
      }
      uVar8 = ~(iVar7 / iVar2);
    }
    else {
      uVar8 = (int)uVar8 / iVar2;
    }
  }
  (__return_storage_ptr__->bigend).vect[2] = uVar8;
  (__return_storage_ptr__->bigend).vect[0] = uVar6 + local_14[0];
  (__return_storage_ptr__->bigend).vect[1] = uVar13 + local_14[1];
  (__return_storage_ptr__->bigend).vect[2] = uVar8 + local_14[2];
LAB_004c7f10:
  lVar11 = 0;
  do {
    iVar7 = ratio->vect[lVar11];
    if (((fine->smallend).vect[lVar11] - (__return_storage_ptr__->smallend).vect[lVar11] * iVar7) *
        2 < iVar7) {
      piVar1 = (__return_storage_ptr__->smallend).vect + lVar11;
      *piVar1 = *piVar1 + -1;
    }
    if (iVar7 <= ((fine->bigend).vect[lVar11] -
                 (__return_storage_ptr__->bigend).vect[lVar11] * iVar7) * 2) {
      piVar1 = (__return_storage_ptr__->bigend).vect + lVar11;
      *piVar1 = *piVar1 + 1;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  return __return_storage_ptr__;
}

Assistant:

Box
MFCellBilinear::CoarseBox (const Box& fine, const IntVect& ratio)
{
    const int* lo = fine.loVect();
    const int* hi = fine.hiVect();

    Box crse(amrex::coarsen(fine,ratio));
    const int* clo = crse.loVect();
    const int* chi = crse.hiVect();

    for (int i = 0; i < AMREX_SPACEDIM; i++) {
        if ((lo[i]-clo[i]*ratio[i])*2 < ratio[i]) {
            crse.growLo(i,1);
        }
        if ((hi[i]-chi[i]*ratio[i])*2 >= ratio[i]) {
            crse.growHi(i,1);
        }
    }
    return crse;
}